

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  string outputFile;
  string inputFile;
  allocator<char> local_51;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"../data/test_data.txt",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"../projects/student/result.txt",&local_51);
  cVar1 = clock();
  init((EVP_PKEY_CTX *)local_30);
  std::operator<<((ostream *)&std::cout,"time:");
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  poVar3 = std::operator<<(poVar3,"s");
  std::endl<char,std::char_traits<char>>(poVar3);
  cVar1 = clock();
  run();
  std::operator<<((ostream *)&std::cout,"time:");
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  poVar3 = std::operator<<(poVar3,"s");
  std::endl<char,std::char_traits<char>>(poVar3);
  cVar1 = clock();
  output(&local_50);
  std::operator<<((ostream *)&std::cout,"time:");
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  poVar3 = std::operator<<(poVar3,"s");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ansNum);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    string inputFile = "../data/test_data.txt";
    string outputFile = "../projects/student/result.txt";
    auto t = clock();
    init(inputFile);
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    t = clock();
    run();
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    t = clock();
    output(outputFile);
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    cout << ansNum << endl;

    return 0;
}